

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::CustomDataLayer>
          (Structure *this,CustomDataLayer *dest,FileDatabase *db)

{
  element_type *this_00;
  FileDatabase *db_local;
  CustomDataLayer *dest_local;
  Structure *this_local;
  
  ReadField<2,int>(this,&dest->type,"type",db);
  ReadField<2,int>(this,&dest->offset,"offset",db);
  ReadField<2,int>(this,&dest->flag,"flag",db);
  ReadField<2,int>(this,&dest->active,"active",db);
  ReadField<2,int>(this,&dest->active_rnd,"active_rnd",db);
  ReadField<2,int>(this,&dest->active_clone,"active_clone",db);
  ReadField<2,int>(this,&dest->active_mask,"active_mask",db);
  ReadField<2,int>(this,&dest->uid,"uid",db);
  ReadFieldArray<1,char,64ul>(this,&dest->name,"name",db);
  ReadCustomDataPtr<2>(this,&dest->data,dest->type,"*data",db);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&db->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure::Convert<CustomDataLayer>(
    CustomDataLayer& dest,
    const FileDatabase& db
    ) const
{
    ReadField<ErrorPolicy_Fail>(dest.type, "type", db);
    ReadField<ErrorPolicy_Fail>(dest.offset, "offset", db);
    ReadField<ErrorPolicy_Fail>(dest.flag, "flag", db);
    ReadField<ErrorPolicy_Fail>(dest.active, "active", db);
    ReadField<ErrorPolicy_Fail>(dest.active_rnd, "active_rnd", db);
    ReadField<ErrorPolicy_Fail>(dest.active_clone, "active_clone", db);
    ReadField<ErrorPolicy_Fail>(dest.active_mask, "active_mask", db);
    ReadField<ErrorPolicy_Fail>(dest.uid, "uid", db);
    ReadFieldArray<ErrorPolicy_Warn>(dest.name, "name", db);
    ReadCustomDataPtr<ErrorPolicy_Fail>(dest.data, dest.type, "*data", db);

    db.reader->IncPtr(size);
}